

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O1

int pmain(lua_State *L)

{
  long lVar1;
  char cVar2;
  Instruction *pIVar3;
  LocVar *pLVar4;
  Upvaldesc *pUVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  ulong uVar8;
  void *pvVar9;
  FILE *__stream;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  byte bVar18;
  uint full;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  Proto *pPVar23;
  Proto *pPVar24;
  uint uVar25;
  uint uVar27;
  char *pcVar28;
  char *pcVar29;
  uint uVar30;
  code *__s1;
  uint i;
  uint i_00;
  uint local_34;
  ulong uVar22;
  ulong uVar26;
  
  uVar8 = lua_tointegerx(L,1,(int *)0x0);
  pvVar9 = lua_touserdata(L,2);
  tmname = L->l_G->tmname;
  uVar30 = (uint)uVar8;
  __s1 = (code *)(uVar8 & 0xffffffff);
  iVar6 = lua_checkstack(L,uVar30);
  full = (uint)__s1;
  if (iVar6 == 0) {
LAB_00103db1:
    pmain_cold_3();
LAB_00103db6:
    pmain_cold_2();
LAB_00103dbe:
    cannot("open");
  }
  else {
    if (0 < (int)uVar30) {
      uVar8 = 0;
      do {
        __s1 = *(code **)((long)pvVar9 + uVar8 * 8);
        iVar6 = strcmp((char *)__s1,"-");
        if (iVar6 == 0) {
          __s1 = (code *)0x0;
        }
        iVar6 = luaL_loadfilex(L,(char *)__s1,(char *)0x0);
        full = (uint)__s1;
        if (iVar6 != 0) {
          pmain_cold_1();
          goto LAB_00103db1;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar30 & 0x7fffffff) != uVar8);
    }
    if (uVar30 == 1) {
      pPVar24 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
    }
    else {
      __s1 = reader;
      local_34 = uVar30;
      iVar6 = lua_load(L,reader,&local_34,"=(luac)",(char *)0x0);
      full = (uint)__s1;
      if (iVar6 != 0) goto LAB_00103db6;
      pPVar24 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
      if (0 < (int)uVar30) {
        lVar10 = (long)(int)~uVar30 << 4;
        uVar8 = 0;
        do {
          __s1 = (code *)pPVar24->p;
          *(Proto **)((long)__s1 + uVar8 * 8) =
               *(Proto **)(*(long *)((long)(L->top).p + lVar10) + 0x18);
          if (0 < pPVar24->p[uVar8]->sizeupvalues) {
            pPVar24->p[uVar8]->upvalues->instack = '\0';
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x10;
        } while ((uVar30 & 0x7fffffff) != uVar8);
      }
    }
    full = (uint)__s1;
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(pPVar24,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x11d3ab;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_00103dbe;
    luaU_dump(L,pPVar24,writer,__stream,(uint)stripping);
    full = (uint)pPVar24;
    iVar6 = ferror(__stream);
    if (iVar6 == 0) {
      iVar6 = fclose(__stream);
      if (iVar6 == 0) {
        return 0;
      }
      goto LAB_00103dd6;
    }
  }
  cannot("write");
LAB_00103dd6:
  pPVar24 = (Proto *)0x11e4a0;
  cannot("close");
  pcVar12 = "=?";
  if (pPVar24->source != (TString *)0x0) {
    pcVar12 = pPVar24->source->contents;
  }
  cVar2 = *pcVar12;
  if (cVar2 == '\x1b') {
    pcVar12 = "(bstring)";
  }
  else if ((cVar2 == '@') || (cVar2 == '=')) {
    pcVar12 = pcVar12 + 1;
  }
  else {
    pcVar12 = "(string)";
  }
  uVar30 = pPVar24->sizep;
  pcVar21 = "function";
  if (pPVar24->linedefined == 0) {
    pcVar21 = "main";
  }
  pcVar16 = "s";
  pcVar28 = "s";
  if (pPVar24->sizecode == 1) {
    pcVar28 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar21,pcVar12,
         (ulong)(uint)pPVar24->linedefined,(ulong)(uint)pPVar24->lastlinedefined,
         (ulong)(uint)pPVar24->sizecode,pcVar28,pPVar24);
  pcVar12 = "+";
  if (pPVar24->is_vararg == '\0') {
    pcVar12 = "";
  }
  pcVar21 = "s";
  if (pPVar24->numparams == 1) {
    pcVar21 = "";
  }
  pcVar28 = "s";
  if (pPVar24->maxstacksize == 1) {
    pcVar28 = "";
  }
  pcVar29 = "s";
  if (pPVar24->sizeupvalues == 1) {
    pcVar29 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)pPVar24->numparams,pcVar12,pcVar21,
         (ulong)pPVar24->maxstacksize,pcVar28,(ulong)(uint)pPVar24->sizeupvalues,pcVar29);
  pcVar12 = "s";
  if (pPVar24->sizelocvars == 1) {
    pcVar12 = "";
  }
  pcVar21 = "s";
  if (pPVar24->sizek == 1) {
    pcVar21 = "";
  }
  if (pPVar24->sizep == 1) {
    pcVar16 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)pPVar24->sizelocvars,pcVar12,
         (ulong)(uint)pPVar24->sizek,pcVar21,(ulong)(uint)pPVar24->sizep,pcVar16,pcVar29);
  iVar6 = pPVar24->sizecode;
  lVar10 = (long)iVar6;
  if (0 < lVar10) {
    pIVar3 = pPVar24->code;
    lVar17 = 0;
    do {
      uVar20 = pIVar3[lVar17];
      iVar6 = (int)lVar17;
      uVar7 = luaG_getfuncline(pPVar24,iVar6);
      lVar1 = lVar17 + 1;
      printf("\t%d\t");
      if ((int)uVar7 < 1) {
        printf("[-]\t");
      }
      else {
        printf("[%d]\t",(ulong)uVar7);
      }
      uVar7 = uVar20 & 0x7f;
      printf("%-9s\t",opnames[uVar7]);
      if (0x52 < uVar7) goto switchD_00104011_caseD_47;
      uVar19 = uVar20 >> 7;
      uVar22 = (ulong)uVar19;
      uVar27 = uVar19 & 0xff;
      i_00 = uVar20 >> 0x10 & 0xff;
      uVar14 = (ulong)i_00;
      uVar25 = uVar20 >> 0x18;
      uVar26 = (ulong)uVar25;
      i = uVar20 >> 0xf;
      uVar13 = (ulong)(i_00 - 0x7f);
      uVar11 = (ulong)(uVar25 - 0x7f);
      uVar15 = i & 1;
      uVar8 = (ulong)uVar15;
      switch(uVar7) {
      case 0:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
        goto LAB_001043be;
      case 1:
      case 2:
        uVar14 = (ulong)(i - 0xffff);
        goto LAB_001043be;
      case 3:
        printf("%d %d",(ulong)uVar27,(ulong)i,uVar11);
        printf("\t; ");
        goto LAB_00104057;
      case 4:
        printf("%d",(ulong)uVar27,uVar13,uVar11);
        printf("\t; ");
        i = pIVar3[lVar17 + 1] >> 7;
        goto LAB_00104057;
      case 5:
      case 6:
      case 7:
      case 0x36:
      case 0x37:
      case 0x48:
      case 0x51:
        pcVar12 = "%d";
        uVar22 = (ulong)uVar27;
        break;
      case 8:
        printf("%d %d",(ulong)uVar27,uVar14,uVar11);
        uVar22 = (ulong)(i_00 + 1);
        pcVar12 = "\t; %d out";
        break;
      case 9:
      case 10:
        printf("%d %d",(ulong)uVar27,uVar14,uVar11);
        lVar17 = *(long *)((long)&pPVar24->upvalues->name + (ulong)(i_00 << 4));
        pPVar23 = (Proto *)0x11d1d1;
        if (lVar17 != 0) {
          pPVar23 = (Proto *)(lVar17 + 0x18);
        }
        goto LAB_00104512;
      case 0xb:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
        lVar17 = *(long *)((long)&pPVar24->upvalues->name + (ulong)(i_00 << 4));
        pcVar12 = "-";
        if (lVar17 != 0) {
          pcVar12 = (char *)(lVar17 + 0x18);
        }
        printf("\t; %s",pcVar12);
        putchar(0x20);
        i = uVar25;
        goto LAB_00104057;
      default:
        uVar8 = uVar26;
        uVar13 = uVar14;
        goto LAB_001040f3;
      case 0xe:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
LAB_0010404b:
        printf("\t; ");
        i = uVar25;
        goto LAB_00104057;
      case 0xf:
        pcVar12 = "break";
        if (uVar15 == 0) {
          pcVar12 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar27,uVar14,uVar26,pcVar12 + 4);
        lVar17 = *(long *)((long)&pPVar24->upvalues->name + (ulong)(uVar27 << 4));
        pcVar12 = "-";
        if (lVar17 != 0) {
          pcVar12 = (char *)(lVar17 + 0x18);
        }
        printf("\t; %s",pcVar12);
        putchar(0x20);
        PrintConstant(pPVar24,i_00);
        goto joined_r0x001042ba;
      case 0x10:
      case 0x11:
      case 0x14:
        pcVar12 = "break";
        if (uVar15 == 0) {
          pcVar12 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar27,uVar14,uVar26,pcVar12 + 4);
        if (uVar15 != 0) goto LAB_0010404b;
        goto switchD_00104011_caseD_47;
      case 0x12:
        pcVar12 = "break";
        if (uVar15 == 0) {
          pcVar12 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar27,uVar14,uVar26,pcVar12 + 4);
        printf("\t; ");
        PrintConstant(pPVar24,i_00);
joined_r0x001042ba:
        if (uVar15 != 0) {
          putchar(0x20);
          i = uVar25;
          goto LAB_00104057;
        }
        goto switchD_00104011_caseD_47;
      case 0x13:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
        uVar20 = pIVar3[lVar17 + 1];
LAB_00104633:
        uVar22 = (ulong)(uVar25 + (uVar20 & 0x3fffff80) * 2);
        pcVar12 = "\t; %d";
        break;
      case 0x15:
      case 0x20:
      case 0x21:
        uVar8 = uVar11;
        uVar13 = uVar14;
        goto LAB_001040f3;
      case 0x2e:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
        pPVar23 = (Proto *)tmname[uVar26]->contents;
LAB_00104512:
        pcVar12 = "\t; %s";
LAB_00104519:
        printf(pcVar12,pPVar23);
        goto switchD_00104011_caseD_47;
      case 0x2f:
        printf("%d %d %d %d",(ulong)uVar27,uVar13,uVar26,uVar8);
        printf("\t; %s",tmname[uVar26]->contents);
        goto LAB_001045f4;
      case 0x30:
        printf("%d %d %d %d",(ulong)uVar27,uVar14,uVar26,uVar8);
        printf("\t; %s ",tmname[uVar26]->contents);
        PrintConstant(pPVar24,i_00);
LAB_001045f4:
        if (uVar15 != 0) {
          pcVar12 = " flip";
LAB_001046e4:
          printf(pcVar12);
        }
        goto switchD_00104011_caseD_47;
      case 0x38:
        printf("%d",(ulong)(uVar19 - 0xffffff),uVar13,uVar11);
        uVar20 = iVar6 + -0xfffffd + (uVar20 >> 7);
        goto LAB_0010469c;
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x43:
        uVar13 = uVar14;
        goto LAB_001040f3;
      case 0x3c:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar8);
        printf("\t; ");
        i = i_00;
LAB_00104057:
        PrintConstant(pPVar24,i);
        goto switchD_00104011_caseD_47;
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
LAB_001040f3:
        printf("%d %d %d",(ulong)uVar27,uVar13,uVar8);
        goto switchD_00104011_caseD_47;
      case 0x42:
        uVar14 = uVar8;
        goto LAB_001043be;
      case 0x44:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
        printf("\t; ");
        if (i_00 == 0) {
          printf("all in ");
        }
        else {
          printf("%d in ",(ulong)(i_00 - 1));
        }
        if (0xffffff < uVar20) {
          uVar22 = (ulong)(uVar25 - 1);
          pcVar12 = "%d out";
          break;
        }
LAB_001046dd:
        pcVar12 = "all out";
        goto LAB_001046e4;
      case 0x45:
        pcVar12 = "break";
        if (uVar15 == 0) {
          pcVar12 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar27,uVar14,uVar26,pcVar12 + 4);
        uVar22 = (ulong)(i_00 - 1);
        pcVar12 = "\t; %d in";
        break;
      case 0x46:
        pcVar12 = "break";
        if (uVar15 == 0) {
          pcVar12 = "[-]\t";
        }
        printf("%d %d %d%s",(ulong)uVar27,uVar14,uVar26,pcVar12 + 4);
        printf("\t; ");
        if (i_00 == 0) goto LAB_001046dd;
        uVar22 = (ulong)(i_00 - 1);
        pcVar12 = "%d out";
        break;
      case 0x47:
        goto switchD_00104011_caseD_47;
      case 0x49:
      case 0x4d:
        printf("%d %d",(ulong)uVar27,(ulong)i,uVar11);
        pcVar12 = "\t; to %d";
        uVar22 = (ulong)((iVar6 - i) + 2);
        break;
      case 0x4a:
        printf("%d %d",(ulong)uVar27,(ulong)i,uVar11);
        uVar22 = (ulong)(iVar6 + 3 + (uVar20 >> 0xf));
        pcVar12 = "\t; exit to %d";
        break;
      case 0x4b:
        printf("%d %d",(ulong)uVar27,(ulong)i,uVar11);
        uVar20 = iVar6 + 2 + (uVar20 >> 0xf);
LAB_0010469c:
        uVar22 = (ulong)uVar20;
        pcVar12 = "\t; to %d";
        break;
      case 0x4c:
        uVar14 = uVar26;
LAB_001043be:
        printf("%d %d",(ulong)uVar27,uVar14,uVar11);
        goto switchD_00104011_caseD_47;
      case 0x4e:
        printf("%d %d %d",(ulong)uVar27,uVar14,uVar26);
        if (uVar15 != 0) {
          uVar20 = pIVar3[lVar17 + 1];
          goto LAB_00104633;
        }
        goto switchD_00104011_caseD_47;
      case 0x4f:
        printf("%d %d",(ulong)uVar27,(ulong)i,uVar11);
        pPVar23 = pPVar24->p[i];
        pcVar12 = "\t; %p";
        goto LAB_00104519;
      case 0x50:
        printf("%d %d",(ulong)uVar27,uVar26,uVar11);
        printf("\t; ");
        if (uVar20 < 0x1000000) goto LAB_001046dd;
        pcVar12 = "%d out";
        uVar22 = (ulong)(uVar25 - 1);
        break;
      case 0x52:
        pcVar12 = "%d";
      }
      printf(pcVar12,uVar22);
switchD_00104011_caseD_47:
      iVar6 = putchar(10);
      lVar17 = lVar1;
    } while (lVar10 != lVar1);
  }
  if (full != 0) {
    uVar20 = pPVar24->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar20,pPVar24);
    if (0 < (long)(int)uVar20) {
      lVar10 = 8;
      uVar8 = 0;
      do {
        printf("\t%d\t",uVar8 & 0xffffffff);
        bVar18 = *(byte *)((long)&pPVar24->k->value_ + lVar10) & 0x3f;
        if (0x10 < bVar18) {
          if (bVar18 == 0x11) goto switchD_00104770_caseD_1;
          if (bVar18 != 0x13) {
            if (bVar18 == 0x14) goto switchD_00104770_caseD_4;
            goto switchD_00104770_caseD_2;
          }
          iVar6 = 0x46;
          goto LAB_001047a2;
        }
        switch(bVar18) {
        case 0:
          iVar6 = 0x4e;
          break;
        case 1:
switchD_00104770_caseD_1:
          iVar6 = 0x42;
          break;
        default:
switchD_00104770_caseD_2:
          printf("?%d");
          goto LAB_001047a7;
        case 3:
          iVar6 = 0x49;
          break;
        case 4:
switchD_00104770_caseD_4:
          iVar6 = 0x53;
        }
LAB_001047a2:
        putchar(iVar6);
LAB_001047a7:
        putchar(9);
        PrintConstant(pPVar24,(int)uVar8);
        putchar(10);
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar20 != uVar8);
    }
    uVar20 = pPVar24->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar20,pPVar24);
    if (0 < (long)(int)uVar20) {
      lVar10 = 0xc;
      uVar8 = 0;
      do {
        pLVar4 = pPVar24->locvars;
        printf("\t%d\t%s\t%d\t%d\n",uVar8 & 0xffffffff,
               *(long *)((long)pLVar4 + lVar10 + -0xc) + 0x18,
               (ulong)(*(int *)((long)pLVar4 + lVar10 + -4) + 1),
               (ulong)(*(int *)((long)&pLVar4->varname + lVar10) + 1));
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar20 != uVar8);
    }
    uVar20 = pPVar24->sizeupvalues;
    iVar6 = printf("upvalues (%d) for %p:\n",(ulong)uVar20,pPVar24);
    if (0 < (long)(int)uVar20) {
      lVar10 = 9;
      uVar8 = 0;
      do {
        pUVar5 = pPVar24->upvalues;
        lVar17 = *(long *)((long)pUVar5 + lVar10 + -9);
        pcVar12 = (char *)(lVar17 + 0x18);
        if (lVar17 == 0) {
          pcVar12 = "-";
        }
        iVar6 = printf("\t%d\t%s\t%d\t%d\n",uVar8 & 0xffffffff,pcVar12,
                       (ulong)*(byte *)((long)pUVar5 + lVar10 + -1),
                       (ulong)*(byte *)((long)&pUVar5->name + lVar10));
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((long)(int)uVar20 != uVar8);
    }
  }
  if (0 < (int)uVar30) {
    uVar8 = 0;
    do {
      PrintFunction(pPVar24->p[uVar8],full);
      uVar8 = uVar8 + 1;
      iVar6 = extraout_EAX;
    } while (uVar30 != uVar8);
  }
  return iVar6;
}

Assistant:

static int pmain(lua_State* L)
{
 int argc=(int)lua_tointeger(L,1);
 char** argv=(char**)lua_touserdata(L,2);
 const Proto* f;
 int i;
 tmname=G(L)->tmname;
 if (!lua_checkstack(L,argc)) fatal("too many input files");
 for (i=0; i<argc; i++)
 {
  const char* filename=IS("-") ? NULL : argv[i];
  if (luaL_loadfile(L,filename)!=LUA_OK) fatal(lua_tostring(L,-1));
 }
 f=combine(L,argc);
 if (listing) luaU_print(f,listing>1);
 if (dumping)
 {
  FILE* D= (output==NULL) ? stdout : fopen(output,"wb");
  if (D==NULL) cannot("open");
  lua_lock(L);
  luaU_dump(L,f,writer,D,stripping);
  lua_unlock(L);
  if (ferror(D)) cannot("write");
  if (fclose(D)) cannot("close");
 }
 return 0;
}